

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O3

string * __thiscall
Test::Output::stripMethodName(string *__return_storage_ptr__,Output *this,string *methodName)

{
  size_type __pos;
  pointer pcVar1;
  size_type sVar2;
  long lVar3;
  size_type sVar4;
  
  pcVar1 = (methodName->_M_dataplus)._M_p;
  sVar2 = methodName->_M_string_length;
  sVar4 = sVar2 + 1;
  do {
    if (sVar4 == 2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
      return __return_storage_ptr__;
    }
    __pos = sVar4 - 1;
    lVar3 = sVar4 - 2;
    sVar4 = __pos;
  } while (pcVar1[lVar3] != ':');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (__return_storage_ptr__,methodName,__pos,0xffffffffffffffff);
  return __return_storage_ptr__;
}

Assistant:

std::string Output::stripMethodName(const std::string &methodName) const {
  std::size_t pos = methodName.size() - 1;
  while (pos > 0) {
    if (methodName[pos] == ':')
      return methodName.substr(pos + 1);
    --pos;
  }
  return methodName;
}